

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.hpp
# Opt level: O0

Foo * miyuki::serialize::fromJson<Foo>(Foo *__return_storage_ptr__,Context *context,json *j)

{
  anon_class_16_2_514e9a72 local_c8;
  undefined1 local_b1;
  undefined1 local_b0 [8];
  InputArchive ar;
  json *j_local;
  Context *context_local;
  Foo *data;
  
  ar.counter.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)j;
  InputArchive::InputArchive((InputArchive *)local_b0,context,j);
  local_b1 = 0;
  Foo::Foo(__return_storage_ptr__);
  local_c8.ar = (InputArchive *)local_b0;
  local_c8.data = __return_storage_ptr__;
  ArchiveBase::
  tryInvoke<miyuki::serialize::fromJson<Foo>(miyuki::serialize::Context&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)::_lambda()_1_>
            ((ArchiveBase *)local_b0,&local_c8);
  local_b1 = 1;
  InputArchive::~InputArchive((InputArchive *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

T fromJson(Context &context, const json::json &j) {
        InputArchive ar(context, j);
        T data;
        ar.tryInvoke([&]() {
            ar._load(data);
        });
        return data;
    }